

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::resolveImport
          (Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *__return_storage_ptr__,
          Node *this,StringPtr name)

{
  Which WVar1;
  int iVar2;
  undefined4 extraout_var;
  CompiledModule *pCVar4;
  Module *pMVar3;
  
  pCVar4 = this->module;
  pMVar3 = pCVar4->parserModule;
  iVar2 = (*(pMVar3->super_ErrorReporter)._vptr_ErrorReporter[4])
                    (pMVar3,name.content.ptr,name.content.size_);
  pMVar3 = (Module *)CONCAT44(extraout_var,iVar2);
  if (pMVar3 != (Module *)0x0) {
    pCVar4 = Impl::addInternal(pCVar4->compiler,pMVar3);
    WVar1 = (pCVar4->rootNode).kind;
    (__return_storage_ptr__->ptr).field_1.value.id = (pCVar4->rootNode).id;
    (__return_storage_ptr__->ptr).field_1.value.genericParamCount = 0;
    (__return_storage_ptr__->ptr).field_1.value.scopeId = 0;
    (__return_storage_ptr__->ptr).field_1.value.kind = WVar1;
    (__return_storage_ptr__->ptr).field_1.value.resolver = &(pCVar4->rootNode).super_Resolver;
    (__return_storage_ptr__->ptr).field_1.value.brand.ptr.isSet = false;
  }
  (__return_storage_ptr__->ptr).isSet = pMVar3 != (Module *)0x0;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolvedDecl>
Compiler::Node::resolveImport(kj::StringPtr name) {
  KJ_IF_MAYBE(m, module->importRelative(name)) {
    Node& root = m->getRootNode();
    return ResolvedDecl { root.id, 0, 0, root.kind, &root, nullptr };
  } else {
    return nullptr;
  }
}